

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

HSQUIRRELVM sq_newthread(HSQUIRRELVM friendvm,SQInteger initialstacksize)

{
  SQUnsignedInteger *pSVar1;
  SQSharedState *ss;
  bool bVar2;
  SQObjectValue this;
  SQObjectPtr local_30;
  
  ss = friendvm->_sharedstate;
  this.pUserPointer = sq_vm_malloc(0x158);
  SQVM::SQVM(this.pThread,ss);
  bVar2 = SQVM::Init(this.pThread,friendvm,initialstacksize);
  if (bVar2) {
    local_30.super_SQObject._type = OT_THREAD;
    pSVar1 = &((this.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    local_30.super_SQObject._unVal.pUserPointer = this.pUserPointer;
    SQVM::Push(friendvm,&local_30);
    SQObjectPtr::~SQObjectPtr(&local_30);
  }
  else {
    (**((this.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted)
              (this.pTable);
    sq_vm_free(this.pUserPointer,0x158);
    this.pTable = (SQTable *)0x0;
  }
  return (HSQUIRRELVM)this.pTable;
}

Assistant:

HSQUIRRELVM sq_newthread(HSQUIRRELVM friendvm, SQInteger initialstacksize)
{
    SQSharedState *ss;
    SQVM *v;
    ss=_ss(friendvm);

    v= (SQVM *)SQ_MALLOC(sizeof(SQVM));
    new (v) SQVM(ss);

    if(v->Init(friendvm, initialstacksize)) {
        friendvm->Push(v);
        return v;
    } else {
        sq_delete(v, SQVM);
        return NULL;
    }
}